

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall notch::core::MakeLayer::logic_error(MakeLayer *this,string *what)

{
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> m;
  
  ::std::operator+(&local_50,"cannot create ",what);
  ::std::operator+(&m,&local_50,": invalid configuration");
  ::std::__cxx11::string::~string((string *)&local_50);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,(string *)&m);
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

void logic_error(std::string what) {
        auto m = "cannot create " + what + ": invalid configuration";
        throw std::logic_error(m);
     }